

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::dense_hashtable(dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *this,dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                        *ht,size_type min_buckets_wanted)

{
  undefined8 uVar1;
  size_type sVar2;
  type pcVar3;
  type pcVar4;
  int *piVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  undefined4 uVar13;
  ulong uVar14;
  size_type sVar15;
  float fVar16;
  
  iVar11 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
           super_Hasher.id_;
  iVar12 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
           super_Hasher.num_hashes_;
  uVar1 = *(undefined8 *)
           &(ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
            super_Hasher.num_compares_;
  sVar15 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
           enlarge_threshold_;
  sVar2 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
          shrink_threshold_;
  fVar16 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
           shrink_factor_;
  bVar6 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
          consider_shrink_;
  bVar7 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
          use_empty_;
  bVar8 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
          use_deleted_;
  uVar9 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
          field_0x2b;
  uVar10 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
           num_ht_copies_;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  enlarge_factor_ =
       (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
       enlarge_factor_;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  shrink_factor_ = fVar16;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  consider_shrink_ = bVar6;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.use_empty_ =
       bVar7;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.use_deleted_
       = bVar8;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.field_0x2b =
       uVar9;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  num_ht_copies_ = uVar10;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  enlarge_threshold_ = sVar15;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  shrink_threshold_ = sVar2;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
  id_ = iVar11;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_hashes_ = iVar12;
  *(undefined8 *)
   &(this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    super_Hasher.num_compares_ = uVar1;
  iVar11 = (ht->key_info).super_Hasher.num_hashes_;
  uVar1 = *(undefined8 *)&(ht->key_info).super_Hasher.num_compares_;
  pcVar3 = (ht->key_info).delkey;
  pcVar4 = (ht->key_info).empty_key;
  (this->key_info).super_Hasher.id_ = (ht->key_info).super_Hasher.id_;
  (this->key_info).super_Hasher.num_hashes_ = iVar11;
  *(undefined8 *)&(this->key_info).super_Hasher.num_compares_ = uVar1;
  (this->key_info).delkey = pcVar3;
  (this->key_info).empty_key = pcVar4;
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = 0;
  uVar13 = *(undefined4 *)
            &(ht->val_info).
             super_alloc_impl<Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
             .
             super_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>
             .field_0x4;
  piVar5 = (ht->val_info).
           super_alloc_impl<Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
           .
           super_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>
           .count_;
  (this->val_info).
  super_alloc_impl<Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
  .super_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>.id_ =
       (ht->val_info).
       super_alloc_impl<Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
       .super_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>.
       id_;
  *(undefined4 *)
   &(this->val_info).
    super_alloc_impl<Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
    .super_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>.
    field_0x4 = uVar13;
  (this->val_info).
  super_alloc_impl<Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
  .super_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>.
  count_ = piVar5;
  this->table = (pointer)0x0;
  if ((ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.use_empty_
      != false) {
    fVar16 = (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
             enlarge_factor_ * 0.0;
    uVar14 = (ulong)fVar16;
    (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    enlarge_threshold_ = (long)(fVar16 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14;
    fVar16 = (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
             shrink_factor_ * 0.0;
    uVar14 = (ulong)fVar16;
    (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    shrink_threshold_ = (long)(fVar16 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14;
    (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    consider_shrink_ = false;
    dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
    ::
    copy_or_move_from<google::dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>const&>
              ((dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                *)this,ht,min_buckets_wanted);
    return;
  }
  sVar15 = sparsehash_internal::sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::
           min_buckets((sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *)this,
                       ht->num_elements - ht->num_deleted,min_buckets_wanted);
  this->num_buckets = sVar15;
  fVar16 = (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
           enlarge_factor_ * (float)sVar15;
  uVar14 = (ulong)fVar16;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar16 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14;
  fVar16 = (float)sVar15 *
           (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
           shrink_factor_;
  uVar14 = (ulong)fVar16;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar16 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  consider_shrink_ = false;
  return;
}

Assistant:

dense_hashtable(const dense_hashtable& ht,
                  size_type min_buckets_wanted = HT_DEFAULT_STARTING_BUCKETS)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        num_elements(0),
        num_buckets(0),
        val_info(ht.val_info),
        table(NULL) {
    if (!ht.settings.use_empty()) {
      // If use_empty isn't set, copy_from will crash, so we do our own copying.
      assert(ht.empty());
      num_buckets = settings.min_buckets(ht.size(), min_buckets_wanted);
      settings.reset_thresholds(bucket_count());
      return;
    }
    settings.reset_thresholds(bucket_count());
    copy_or_move_from(ht, min_buckets_wanted);  // copy_or_move_from() ignores deleted entries
  }